

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

void __thiscall symbols::LenFunction::LenFunction(LenFunction *this)

{
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"len","");
  (this->super_BuiltinFunction).super_BuiltinObject.super_Object._type = BUILTINFUNCTION;
  (this->super_BuiltinFunction).super_BuiltinObject.super_Object._vptr_Object =
       (_func_int **)&PTR_type_00124d50;
  (this->super_BuiltinFunction).func_name._M_dataplus._M_p =
       (pointer)&(this->super_BuiltinFunction).func_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_BuiltinFunction).func_name,local_38,local_30 + (long)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  (this->super_BuiltinFunction).super_BuiltinObject.super_Object._vptr_Object =
       (_func_int **)&PTR_type_00123f88;
  return;
}

Assistant:

LenFunction()
                :BuiltinFunction("len"){}